

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTextMessageContent.h
# Opt level: O3

void __thiscall
TgBot::InputTextMessageContent::InputTextMessageContent(InputTextMessageContent *this)

{
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"InputTextMessageContent","");
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputMessageContent_002a6a18;
  (this->super_InputMessageContent).type._M_dataplus._M_p =
       (pointer)&(this->super_InputMessageContent).type.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_InputMessageContent).type,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputTextMessageContent_002a69d0;
  (this->messageText)._M_dataplus._M_p = (pointer)&(this->messageText).field_2;
  (this->messageText)._M_string_length = 0;
  (this->messageText).field_2._M_local_buf[0] = '\0';
  (this->parseMode)._M_dataplus._M_p = (pointer)&(this->parseMode).field_2;
  (this->parseMode)._M_string_length = 0;
  (this->parseMode).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputTextMessageContent():
        InputMessageContent("InputTextMessageContent")
    {}